

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer.h
# Opt level: O3

void __thiscall brotli::RingBuffer::Write(RingBuffer *this,uint8_t *bytes,size_t n)

{
  long lVar1;
  size_t __n;
  ulong uVar2;
  uint uVar3;
  uint8_t *__dest;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = this->mask_ & this->pos_;
  uVar5 = (ulong)uVar4;
  if (uVar4 < this->tail_size_) {
    uVar2 = this->tail_size_ - uVar5;
    if (n <= uVar2) {
      uVar2 = n;
    }
    memcpy(this->buffer_ + uVar5 + this->size_,bytes,uVar2);
  }
  __dest = this->buffer_ + uVar5;
  __n = n;
  if ((ulong)this->size_ < uVar5 + n) {
    uVar2 = (this->size_ + this->tail_size_) - uVar5;
    if (n <= uVar2) {
      uVar2 = n;
    }
    memcpy(__dest,bytes,uVar2);
    __dest = this->buffer_;
    lVar1 = this->size_ - uVar5;
    bytes = bytes + lVar1;
    __n = n - lVar1;
  }
  memcpy(__dest,bytes,__n);
  this->buffer_[-2] = this->buffer_[this->size_ - 2];
  this->buffer_[-1] = this->buffer_[this->size_ - 1];
  uVar3 = (int)n + this->pos_;
  uVar4 = uVar3 & 0x3fffffff | 0x40000000;
  if (uVar3 < 0x40000001) {
    uVar4 = uVar3;
  }
  this->pos_ = uVar4;
  return;
}

Assistant:

void Write(const uint8_t *bytes, size_t n) {
    const size_t masked_pos = pos_ & mask_;
    // The length of the writes is limited so that we do not need to worry
    // about a write
    WriteTail(bytes, n);
    if (PREDICT_TRUE(masked_pos + n <= size_)) {
      // A single write fits.
      memcpy(&buffer_[masked_pos], bytes, n);
    } else {
      // Split into two writes.
      // Copy into the end of the buffer, including the tail buffer.
      memcpy(&buffer_[masked_pos], bytes,
             std::min(n, (size_ + tail_size_) - masked_pos));
      // Copy into the beginning of the buffer
      memcpy(&buffer_[0], bytes + (size_ - masked_pos),
             n - (size_ - masked_pos));
    }
    buffer_[-2] = buffer_[size_ - 2];
    buffer_[-1] = buffer_[size_ - 1];
    pos_ += static_cast<uint32_t>(n);
    if (pos_ > (1u << 30)) {  /* Wrap, but preserve not-a-first-lap feature. */
      pos_ = (pos_ & ((1u << 30) - 1)) | (1u << 30);
    }
  }